

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O2

value_ptr __thiscall pstore::dump::make_value(dump *this,digest *d)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  string str;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>
            (d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  make_value((string *)this);
  std::__cxx11::string::~string((string *)&local_30);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (index::digest const & d) {
            std::string str;
            d.to_hex (std::back_inserter (str));
            return make_value (str);
        }